

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigpipe.h
# Opt level: O1

void sigpipe_apply(Curl_easy *data,sigpipe_ignore *ig)

{
  _union_1457 local_a8 [19];
  
  if (*(uint *)&(data->set).field_0x8ca >> 0x1f != (uint)ig->no_signal) {
    if (ig->no_signal == false) {
      sigaction(0xd,(sigaction *)ig,(sigaction *)0x0);
    }
    ig->no_signal = SUB41((uint)*(undefined4 *)&(data->set).field_0x8ca >> 0x1f,0);
    if (((data->set).field_0x8cd & 0x80) == 0) {
      sigaction(0xd,(sigaction *)0x0,(sigaction *)ig);
      memcpy(local_a8,ig,0x98);
      local_a8[0] = (_union_1457)0x1;
      sigaction(0xd,(sigaction *)local_a8,(sigaction *)0x0);
    }
  }
  return;
}

Assistant:

static void sigpipe_apply(struct Curl_easy *data,
                          struct sigpipe_ignore *ig)
{
  if(data->set.no_signal != ig->no_signal) {
    sigpipe_restore(ig);
    sigpipe_ignore(data, ig);
  }
}